

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoleculeStamp.cpp
# Opt level: O0

void __thiscall OpenMD::MoleculeStamp::checkInversions(MoleculeStamp *this)

{
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __first;
  ulong uVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  size_type sVar5;
  ostream *poVar6;
  undefined8 uVar7;
  reference piVar8;
  reference pvVar9;
  OpenMDException *this_00;
  string *msg;
  long in_RDI;
  pair<std::_Rb_tree_const_iterator<std::tuple<int,_int,_int,_int>_>,_bool> pVar10;
  InversionStamp *newInversionStamp;
  type_conflict *fourth_1;
  type_conflict *third_1;
  type_conflict *second_1;
  type_conflict *first_1;
  tuple<int,_int,_int,_int> newInversion;
  int cent_1;
  int a_1;
  vector<int,_std::allocator<int>_> satellites_1;
  AtomIter ai2;
  AtomStamp *ai;
  size_t i_4;
  type_conflict *fourth;
  type_conflict *third;
  type_conflict *second;
  type_conflict *first;
  tuple<int,_int,_int,_int> inversionTuple;
  vector<int,_std::allocator<int>_> inversion;
  int cent;
  InversionStamp *inversionStamp_3;
  size_t i_3;
  iterator iter;
  set<std::tuple<int,_int,_int,_int>,_std::less<std::tuple<int,_int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int,_int>_>_>
  allInversions;
  int rigidbodyIndex;
  iterator j_2;
  vector<int,_std::allocator<int>_> rigidSet;
  vector<int,_std::allocator<int>_> inversionAtoms_1;
  InversionStamp *inversionStamp_2;
  size_t i_2;
  iterator k;
  iterator j_1;
  vector<int,_std::allocator<int>_> inversionAtoms;
  InversionStamp *inversionStamp_1;
  size_t i_1;
  int b;
  int a;
  BondStamp *bondStamp;
  size_t j;
  vector<int,_std::allocator<int>_> satellites;
  int center;
  InversionStamp *inversionStamp;
  size_t i;
  ostringstream oss;
  undefined4 in_stack_fffffffffffff6b8;
  int in_stack_fffffffffffff6bc;
  MoleculeStamp *in_stack_fffffffffffff6c0;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffff6c8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffff6d0;
  value_type *in_stack_fffffffffffff6d8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffff6e0;
  undefined7 in_stack_fffffffffffff6e8;
  undefined1 in_stack_fffffffffffff6ef;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffff6f0;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffff6f8;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffff760;
  undefined7 in_stack_fffffffffffff868;
  undefined1 in_stack_fffffffffffff86f;
  undefined7 in_stack_fffffffffffff898;
  undefined1 in_stack_fffffffffffff89f;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffff8a0;
  string local_668 [32];
  AtomStamp *local_648;
  _Base_ptr local_640;
  undefined1 local_638;
  _Self local_630;
  _Self local_628;
  __tuple_element_t<3UL,_tuple<int,_int,_int,_int>_> *local_620;
  int *local_618;
  __tuple_element_t<1UL,_tuple<int,_int,_int,_int>_> *local_610;
  __tuple_element_t<0UL,_tuple<int,_int,_int,_int>_> *local_608;
  undefined8 local_600;
  undefined8 local_5f8;
  undefined8 local_5f0;
  undefined8 local_5e8;
  int *local_5e0;
  int *local_5d8;
  int local_5d0;
  int local_5cc;
  vector<int,_std::allocator<int>_> local_5c8;
  _Rb_tree_const_iterator<int> local_5b0;
  AtomStamp *local_5a8;
  ulong local_5a0;
  undefined1 local_591;
  string local_570 [32];
  string local_550 [32];
  _Base_ptr local_530;
  undefined1 local_528;
  _Self local_520;
  _Base_ptr local_518;
  __tuple_element_t<3UL,_tuple<int,_int,_int,_int>_> *local_510;
  int *local_508;
  __tuple_element_t<1UL,_tuple<int,_int,_int,_int>_> *local_500;
  __tuple_element_t<0UL,_tuple<int,_int,_int,_int>_> *local_4f8;
  undefined1 *local_4f0;
  undefined1 local_4e8 [16];
  vector<int,_std::allocator<int>_> local_4d8;
  int local_4bc;
  InversionStamp *local_4b8;
  ulong local_4b0;
  _Rb_tree_const_iterator<std::tuple<int,_int,_int,_int>_> local_4a8 [7];
  undefined1 local_469;
  string local_448 [36];
  int local_424;
  int *local_420;
  int *local_418;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_410;
  undefined4 local_404;
  vector<int,_std::allocator<int>_> local_400;
  int local_3e4;
  InversionStamp *local_3c8;
  ulong local_3c0;
  undefined1 local_3b1;
  string local_390 [32];
  string local_370 [39];
  undefined1 local_349;
  string local_328 [32];
  string local_308 [32];
  int *local_2e8;
  int *local_2e0;
  undefined4 local_2d8;
  int *local_2c8;
  int *local_2c0;
  int *local_2b8;
  long local_2b0;
  int *local_290;
  int *local_288;
  int *local_280;
  int *local_278;
  int local_26c;
  int *local_268;
  InversionStamp *local_240;
  ulong local_238;
  undefined1 local_229;
  string local_208 [32];
  int *local_1e8;
  int *local_1e0;
  int local_1d8;
  int local_1d4;
  BondStamp *local_1d0;
  ulong local_1c8;
  vector<int,_std::allocator<int>_> local_1c0;
  int local_1a4;
  InversionStamp *local_1a0;
  ulong local_188;
  ostringstream local_180 [384];
  
  std::__cxx11::ostringstream::ostringstream(local_180);
  local_188 = 0;
  do {
    uVar1 = local_188;
    sVar4 = getNInversions((MoleculeStamp *)0x2b7265);
    if (sVar4 <= uVar1) {
      local_238 = 0;
      while( true ) {
        uVar1 = local_238;
        sVar4 = getNInversions((MoleculeStamp *)0x2b76e4);
        if (sVar4 <= uVar1) {
          for (local_3c0 = 0; uVar1 = local_3c0, sVar4 = getNInversions((MoleculeStamp *)0x2b7e05),
              uVar1 < sVar4; local_3c0 = local_3c0 + 1) {
            local_3c8 = getInversionStamp(in_stack_fffffffffffff6c0,in_stack_fffffffffffff6bc);
            InversionStamp::getSatellites
                      ((InversionStamp *)
                       CONCAT44(in_stack_fffffffffffff6bc,in_stack_fffffffffffff6b8));
            local_3e4 = InversionStamp::getCenter(local_3c8);
            std::vector<int,_std::allocator<int>_>::push_back
                      ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff6c0,
                       (value_type_conflict3 *)
                       CONCAT44(in_stack_fffffffffffff6bc,in_stack_fffffffffffff6b8));
            getNRigidBodies((MoleculeStamp *)0x2b7eb5);
            local_404 = 0;
            std::allocator<int>::allocator((allocator<int> *)0x2b7edf);
            std::vector<int,_std::allocator<int>_>::vector
                      ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff6e0._M_current,
                       (size_type)in_stack_fffffffffffff6d8,in_stack_fffffffffffff6d0._M_current,
                       (allocator_type *)in_stack_fffffffffffff6c8._M_current);
            std::allocator<int>::~allocator((allocator<int> *)0x2b7f13);
            __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
            __normal_iterator(&local_410);
            local_418 = (int *)std::vector<int,_std::allocator<int>_>::begin
                                         ((vector<int,_std::allocator<int>_> *)
                                          CONCAT44(in_stack_fffffffffffff6bc,
                                                   in_stack_fffffffffffff6b8));
            local_410._M_current = local_418;
            while( true ) {
              local_420 = (int *)std::vector<int,_std::allocator<int>_>::end
                                           ((vector<int,_std::allocator<int>_> *)
                                            CONCAT44(in_stack_fffffffffffff6bc,
                                                     in_stack_fffffffffffff6b8));
              bVar2 = __gnu_cxx::operator!=
                                ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                  *)in_stack_fffffffffffff6c0,
                                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                  *)CONCAT44(in_stack_fffffffffffff6bc,in_stack_fffffffffffff6b8));
              if (!bVar2) break;
              piVar8 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                       ::operator*(&local_410);
              pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                                 ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x1d8),
                                  (long)*piVar8);
              local_424 = *pvVar9;
              if (-1 < local_424) {
                pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                                   (&local_400,(long)local_424);
                *pvVar9 = *pvVar9 + 1;
                pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                                   (&local_400,(long)local_424);
                if (3 < *pvVar9) {
                  poVar6 = std::operator<<((ostream *)local_180,"Error in Molecule ");
                  getName_abi_cxx11_((MoleculeStamp *)
                                     CONCAT44(in_stack_fffffffffffff6bc,in_stack_fffffffffffff6b8));
                  poVar6 = std::operator<<(poVar6,local_448);
                  poVar6 = std::operator<<(poVar6,": inversion centered on atom ");
                  iVar3 = InversionStamp::getCenter(local_3c8);
                  poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar3);
                  poVar6 = std::operator<<(poVar6," has four atoms that belong to same rigidbody ");
                  poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_424);
                  std::operator<<(poVar6,"\n");
                  std::__cxx11::string::~string(local_448);
                  local_469 = 1;
                  uVar7 = __cxa_allocate_exception(0x28);
                  std::__cxx11::ostringstream::str();
                  OpenMDException::OpenMDException
                            ((OpenMDException *)in_stack_fffffffffffff6d0._M_current,
                             (string *)in_stack_fffffffffffff6c8._M_current);
                  local_469 = 0;
                  __cxa_throw(uVar7,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
                }
              }
              __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
              operator++(&local_410);
            }
            std::vector<int,_std::allocator<int>_>::~vector
                      ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff6d0._M_current);
            std::vector<int,_std::allocator<int>_>::~vector
                      ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff6d0._M_current);
          }
          std::
          set<std::tuple<int,_int,_int,_int>,_std::less<std::tuple<int,_int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int,_int>_>_>
          ::set((set<std::tuple<int,_int,_int,_int>,_std::less<std::tuple<int,_int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int,_int>_>_>
                 *)0x2b82b6);
          std::_Rb_tree_const_iterator<std::tuple<int,_int,_int,_int>_>::_Rb_tree_const_iterator
                    (local_4a8);
          local_4b0 = 0;
          while( true ) {
            uVar1 = local_4b0;
            sVar4 = getNInversions((MoleculeStamp *)0x2b82ec);
            if (sVar4 <= uVar1) {
              local_5a0 = 0;
              do {
                uVar1 = local_5a0;
                sVar4 = getNAtoms((MoleculeStamp *)0x2b8815);
                if (sVar4 <= uVar1) {
                  std::
                  set<std::tuple<int,_int,_int,_int>,_std::less<std::tuple<int,_int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int,_int>_>_>
                  ::~set((set<std::tuple<int,_int,_int,_int>,_std::less<std::tuple<int,_int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int,_int>_>_>
                          *)0x2b8dd0);
                  std::__cxx11::ostringstream::~ostringstream(local_180);
                  return;
                }
                local_5a8 = getAtomStamp(in_stack_fffffffffffff6c0,in_stack_fffffffffffff6bc);
                sVar4 = AtomStamp::getCoordination((AtomStamp *)0x2b8873);
                if (sVar4 == 3) {
                  std::_Rb_tree_const_iterator<int>::_Rb_tree_const_iterator(&local_5b0);
                  std::vector<int,_std::allocator<int>_>::vector
                            ((vector<int,_std::allocator<int>_> *)0x2b88a8);
                  local_5cc = AtomStamp::getFirstBondedAtom
                                        ((AtomStamp *)in_stack_fffffffffffff6e0._M_current,
                                         (AtomIter *)in_stack_fffffffffffff6d8);
                  while (local_5cc != -1) {
                    std::vector<int,_std::allocator<int>_>::push_back
                              ((vector<int,_std::allocator<int>_> *)
                               in_stack_fffffffffffff6d0._M_current,
                               in_stack_fffffffffffff6c8._M_current);
                    local_5cc = AtomStamp::getNextBondedAtom
                                          ((AtomStamp *)in_stack_fffffffffffff6e0._M_current,
                                           (AtomIter *)in_stack_fffffffffffff6d8);
                  }
                  sVar5 = std::vector<int,_std::allocator<int>_>::size(&local_5c8);
                  if (sVar5 != 3) {
                    poVar6 = std::operator<<((ostream *)local_180,"Error in Molecule ");
                    getName_abi_cxx11_((MoleculeStamp *)
                                       CONCAT44(in_stack_fffffffffffff6bc,in_stack_fffffffffffff6b8)
                                      );
                    this_00 = (OpenMDException *)std::operator<<(poVar6,local_668);
                    msg = (string *)std::operator<<((ostream *)this_00,": found bond mismatch");
                    std::operator<<((ostream *)msg," when detecting inversion centers.");
                    std::__cxx11::string::~string(local_668);
                    uVar7 = __cxa_allocate_exception(0x28);
                    std::__cxx11::ostringstream::str();
                    OpenMDException::OpenMDException(this_00,msg);
                    __cxa_throw(uVar7,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
                  }
                  local_5d0 = AtomStamp::getIndex(local_5a8);
                  local_5d8 = (int *)std::vector<int,_std::allocator<int>_>::begin
                                               ((vector<int,_std::allocator<int>_> *)
                                                CONCAT44(in_stack_fffffffffffff6bc,
                                                         in_stack_fffffffffffff6b8));
                  local_5e0 = (int *)std::vector<int,_std::allocator<int>_>::end
                                               ((vector<int,_std::allocator<int>_> *)
                                                CONCAT44(in_stack_fffffffffffff6bc,
                                                         in_stack_fffffffffffff6b8));
                  std::sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                            (in_stack_fffffffffffff6d0,in_stack_fffffffffffff6c8);
                  std::vector<int,_std::allocator<int>_>::operator[](&local_5c8,0);
                  std::vector<int,_std::allocator<int>_>::operator[](&local_5c8,1);
                  std::vector<int,_std::allocator<int>_>::operator[](&local_5c8,2);
                  std::tuple<int,_int,_int,_int>::tuple<int_&,_int_&,_int_&,_int_&,_true,_true>
                            ((tuple<int,_int,_int,_int> *)in_stack_fffffffffffff6d0._M_current,
                             in_stack_fffffffffffff6c8._M_current,(int *)in_stack_fffffffffffff6c0,
                             (int *)CONCAT44(in_stack_fffffffffffff6bc,in_stack_fffffffffffff6b8),
                             (int *)0x2b8a08);
                  local_600 = local_5f0;
                  local_5f8 = local_5e8;
                  local_608 = std::get<0ul,int,int,int,int>((tuple<int,_int,_int,_int> *)0x2b8a35);
                  local_610 = std::get<1ul,int,int,int,int>((tuple<int,_int,_int,_int> *)0x2b8a4a);
                  local_618 = std::get<2ul,int,int,int,int>((tuple<int,_int,_int,_int> *)0x2b8a5f);
                  local_620 = std::get<3ul,int,int,int,int>((tuple<int,_int,_int,_int> *)0x2b8a74);
                  if (*local_620 < *local_618) {
                    std::swap<int>(local_618,local_620);
                  }
                  if (*local_618 < *local_610) {
                    std::swap<int>(local_610,local_618);
                  }
                  if (*local_620 < *local_618) {
                    std::swap<int>(local_618,local_620);
                  }
                  local_628._M_node =
                       (_Base_ptr)
                       std::
                       set<std::tuple<int,_int,_int,_int>,_std::less<std::tuple<int,_int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int,_int>_>_>
                       ::find((set<std::tuple<int,_int,_int,_int>,_std::less<std::tuple<int,_int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int,_int>_>_>
                               *)in_stack_fffffffffffff6c8._M_current,
                              (key_type *)in_stack_fffffffffffff6c0);
                  local_630._M_node =
                       (_Base_ptr)
                       std::
                       set<std::tuple<int,_int,_int,_int>,_std::less<std::tuple<int,_int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int,_int>_>_>
                       ::end((set<std::tuple<int,_int,_int,_int>,_std::less<std::tuple<int,_int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int,_int>_>_>
                              *)CONCAT44(in_stack_fffffffffffff6bc,in_stack_fffffffffffff6b8));
                  bVar2 = std::operator==(&local_628,&local_630);
                  if (bVar2) {
                    pVar10 = std::
                             set<std::tuple<int,_int,_int,_int>,_std::less<std::tuple<int,_int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int,_int>_>_>
                             ::insert((set<std::tuple<int,_int,_int,_int>,_std::less<std::tuple<int,_int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int,_int>_>_>
                                       *)in_stack_fffffffffffff6e0._M_current,
                                      in_stack_fffffffffffff6d8);
                    local_640 = (_Base_ptr)pVar10.first._M_node;
                    local_638 = pVar10.second;
                    in_stack_fffffffffffff6e0._M_current = (int *)operator_new(0xf8);
                    InversionStamp::InversionStamp
                              ((InversionStamp *)in_stack_fffffffffffff6d0._M_current);
                    local_648 = (AtomStamp *)in_stack_fffffffffffff6e0._M_current;
                    InversionStamp::setCenter
                              ((InversionStamp *)in_stack_fffffffffffff6e0._M_current,local_5d0);
                    InversionStamp::setSatellites
                              ((InversionStamp *)in_stack_fffffffffffff8a0._M_current,
                               (vector<int,_std::allocator<int>_> *)
                               CONCAT17(in_stack_fffffffffffff89f,in_stack_fffffffffffff898));
                    addInversionStamp(in_stack_fffffffffffff6c0,
                                      (InversionStamp *)
                                      CONCAT44(in_stack_fffffffffffff6bc,in_stack_fffffffffffff6b8))
                    ;
                  }
                  std::vector<int,_std::allocator<int>_>::~vector
                            ((vector<int,_std::allocator<int>_> *)
                             in_stack_fffffffffffff6d0._M_current);
                }
                local_5a0 = local_5a0 + 1;
              } while( true );
            }
            local_4b8 = getInversionStamp(in_stack_fffffffffffff6c0,in_stack_fffffffffffff6bc);
            local_4bc = InversionStamp::getCenter(local_4b8);
            InversionStamp::getSatellites
                      ((InversionStamp *)
                       CONCAT44(in_stack_fffffffffffff6bc,in_stack_fffffffffffff6b8));
            std::vector<int,_std::allocator<int>_>::operator[](&local_4d8,0);
            std::vector<int,_std::allocator<int>_>::operator[](&local_4d8,1);
            std::vector<int,_std::allocator<int>_>::operator[](&local_4d8,2);
            std::tuple<int,_int,_int,_int>::tuple<int_&,_int_&,_int_&,_int_&,_true,_true>
                      ((tuple<int,_int,_int,_int> *)in_stack_fffffffffffff6d0._M_current,
                       in_stack_fffffffffffff6c8._M_current,(int *)in_stack_fffffffffffff6c0,
                       (int *)CONCAT44(in_stack_fffffffffffff6bc,in_stack_fffffffffffff6b8),
                       (int *)0x2b83e5);
            local_4f0 = local_4e8;
            local_4f8 = std::get<0ul,int,int,int,int>((tuple<int,_int,_int,_int> *)0x2b8402);
            local_500 = std::get<1ul,int,int,int,int>((tuple<int,_int,_int,_int> *)0x2b8417);
            local_508 = std::get<2ul,int,int,int,int>((tuple<int,_int,_int,_int> *)0x2b842c);
            local_510 = std::get<3ul,int,int,int,int>((tuple<int,_int,_int,_int> *)0x2b8441);
            if (*local_510 < *local_508) {
              std::swap<int>(local_508,local_510);
            }
            if (*local_508 < *local_500) {
              std::swap<int>(local_500,local_508);
            }
            if (*local_510 < *local_508) {
              std::swap<int>(local_508,local_510);
            }
            local_518 = (_Base_ptr)
                        std::
                        set<std::tuple<int,_int,_int,_int>,_std::less<std::tuple<int,_int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int,_int>_>_>
                        ::find((set<std::tuple<int,_int,_int,_int>,_std::less<std::tuple<int,_int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int,_int>_>_>
                                *)in_stack_fffffffffffff6c8._M_current,
                               (key_type *)in_stack_fffffffffffff6c0);
            local_4a8[0]._M_node = local_518;
            local_520._M_node =
                 (_Base_ptr)
                 std::
                 set<std::tuple<int,_int,_int,_int>,_std::less<std::tuple<int,_int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int,_int>_>_>
                 ::end((set<std::tuple<int,_int,_int,_int>,_std::less<std::tuple<int,_int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int,_int>_>_>
                        *)CONCAT44(in_stack_fffffffffffff6bc,in_stack_fffffffffffff6b8));
            bVar2 = std::operator==(local_4a8,&local_520);
            if (!bVar2) break;
            pVar10 = std::
                     set<std::tuple<int,_int,_int,_int>,_std::less<std::tuple<int,_int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int,_int>_>_>
                     ::insert((set<std::tuple<int,_int,_int,_int>,_std::less<std::tuple<int,_int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int,_int>_>_>
                               *)in_stack_fffffffffffff6e0._M_current,in_stack_fffffffffffff6d8);
            local_530 = (_Base_ptr)pVar10.first._M_node;
            local_528 = pVar10.second;
            std::vector<int,_std::allocator<int>_>::~vector
                      ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff6d0._M_current);
            local_4b0 = local_4b0 + 1;
          }
          poVar6 = std::operator<<((ostream *)local_180,"Error in Molecule ");
          getName_abi_cxx11_((MoleculeStamp *)
                             CONCAT44(in_stack_fffffffffffff6bc,in_stack_fffffffffffff6b8));
          poVar6 = std::operator<<(poVar6,local_550);
          poVar6 = std::operator<<(poVar6,": ");
          poVar6 = std::operator<<(poVar6,"Inversion");
          containerToString<std::vector<int,std::allocator<int>>>
                    ((vector<int,_std::allocator<int>_> *)
                     CONCAT17(in_stack_fffffffffffff86f,in_stack_fffffffffffff868));
          poVar6 = std::operator<<(poVar6,local_570);
          std::operator<<(poVar6," appears multiple times\n");
          std::__cxx11::string::~string(local_570);
          std::__cxx11::string::~string(local_550);
          local_591 = 1;
          uVar7 = __cxa_allocate_exception(0x28);
          std::__cxx11::ostringstream::str();
          OpenMDException::OpenMDException
                    ((OpenMDException *)in_stack_fffffffffffff6d0._M_current,
                     (string *)in_stack_fffffffffffff6c8._M_current);
          local_591 = 0;
          __cxa_throw(uVar7,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
        }
        local_240 = getInversionStamp(in_stack_fffffffffffff6c0,in_stack_fffffffffffff6bc);
        InversionStamp::getSatellites
                  ((InversionStamp *)CONCAT44(in_stack_fffffffffffff6bc,in_stack_fffffffffffff6b8));
        local_268 = (int *)std::vector<int,_std::allocator<int>_>::begin
                                     ((vector<int,_std::allocator<int>_> *)
                                      CONCAT44(in_stack_fffffffffffff6bc,in_stack_fffffffffffff6b8))
        ;
        __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
        __normal_iterator<int*>
                  ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                   in_stack_fffffffffffff6c0,
                   (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                   CONCAT44(in_stack_fffffffffffff6bc,in_stack_fffffffffffff6b8));
        local_26c = InversionStamp::getCenter(local_240);
        local_278 = (int *)std::vector<int,_std::allocator<int>_>::insert
                                     ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff6c0
                                      ,in_stack_fffffffffffff6c8._M_current,
                                      (value_type_conflict3 *)
                                      CONCAT44(in_stack_fffffffffffff6bc,in_stack_fffffffffffff6b8))
        ;
        local_288 = (int *)std::vector<int,_std::allocator<int>_>::begin
                                     ((vector<int,_std::allocator<int>_> *)
                                      CONCAT44(in_stack_fffffffffffff6bc,in_stack_fffffffffffff6b8))
        ;
        local_290 = (int *)std::vector<int,_std::allocator<int>_>::end
                                     ((vector<int,_std::allocator<int>_> *)
                                      CONCAT44(in_stack_fffffffffffff6bc,in_stack_fffffffffffff6b8))
        ;
        sVar4 = getNAtoms((MoleculeStamp *)0x2b7810);
        local_2b0 = sVar4 - 1;
        std::bind<std::greater<int>,std::_Placeholder<1>const&,unsigned_long>
                  ((greater<int> *)in_stack_fffffffffffff6c8._M_current,
                   (_Placeholder<1> *)in_stack_fffffffffffff6c0,
                   (unsigned_long *)CONCAT44(in_stack_fffffffffffff6bc,in_stack_fffffffffffff6b8));
        local_280 = (int *)std::
                           find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::_Bind<std::greater<int>(std::_Placeholder<1>,unsigned_long)>>
                                     (in_stack_fffffffffffff6f8,in_stack_fffffffffffff6f0,
                                      (_Bind<std::greater<int>_(std::_Placeholder<1>,_unsigned_long)>
                                       *)CONCAT17(in_stack_fffffffffffff6ef,
                                                  in_stack_fffffffffffff6e8));
        local_2c0 = (int *)std::vector<int,_std::allocator<int>_>::begin
                                     ((vector<int,_std::allocator<int>_> *)
                                      CONCAT44(in_stack_fffffffffffff6bc,in_stack_fffffffffffff6b8))
        ;
        local_2c8 = (int *)std::vector<int,_std::allocator<int>_>::end
                                     ((vector<int,_std::allocator<int>_> *)
                                      CONCAT44(in_stack_fffffffffffff6bc,in_stack_fffffffffffff6b8))
        ;
        local_2d8 = 0;
        std::bind<std::less<int>,std::_Placeholder<1>const&,int>
                  ((less<int> *)in_stack_fffffffffffff6c8._M_current,
                   (_Placeholder<1> *)in_stack_fffffffffffff6c0,
                   (int *)CONCAT44(in_stack_fffffffffffff6bc,in_stack_fffffffffffff6b8));
        __first._M_current._7_1_ = in_stack_fffffffffffff6ef;
        __first._M_current._0_7_ = in_stack_fffffffffffff6e8;
        in_stack_fffffffffffff8a0 =
             std::
             find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::_Bind<std::less<int>(std::_Placeholder<1>,int)>>
                       (__first,in_stack_fffffffffffff6e0,
                        (_Bind<std::less<int>_(std::_Placeholder<1>,_int)> *)
                        in_stack_fffffffffffff6d8);
        local_2b8 = in_stack_fffffffffffff8a0._M_current;
        local_2e0 = (int *)std::vector<int,_std::allocator<int>_>::end
                                     ((vector<int,_std::allocator<int>_> *)
                                      CONCAT44(in_stack_fffffffffffff6bc,in_stack_fffffffffffff6b8))
        ;
        bVar2 = __gnu_cxx::operator!=
                          ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                           in_stack_fffffffffffff6c0,
                           (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                           CONCAT44(in_stack_fffffffffffff6bc,in_stack_fffffffffffff6b8));
        in_stack_fffffffffffff89f = true;
        if (!bVar2) {
          local_2e8 = (int *)std::vector<int,_std::allocator<int>_>::end
                                       ((vector<int,_std::allocator<int>_> *)
                                        CONCAT44(in_stack_fffffffffffff6bc,in_stack_fffffffffffff6b8
                                                ));
          in_stack_fffffffffffff89f =
               __gnu_cxx::operator!=
                         ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                          in_stack_fffffffffffff6c0,
                          (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                          CONCAT44(in_stack_fffffffffffff6bc,in_stack_fffffffffffff6b8));
        }
        if ((bool)in_stack_fffffffffffff89f != false) break;
        in_stack_fffffffffffff86f =
             hasDuplicateElement<std::vector<int,std::allocator<int>>>(in_stack_fffffffffffff760);
        if ((bool)in_stack_fffffffffffff86f) {
          poVar6 = std::operator<<((ostream *)local_180,"Error in Molecule ");
          getName_abi_cxx11_((MoleculeStamp *)
                             CONCAT44(in_stack_fffffffffffff6bc,in_stack_fffffffffffff6b8));
          poVar6 = std::operator<<(poVar6,local_370);
          poVar6 = std::operator<<(poVar6," : atoms of inversion");
          containerToString<std::vector<int,std::allocator<int>>>
                    ((vector<int,_std::allocator<int>_> *)
                     CONCAT17(in_stack_fffffffffffff86f,in_stack_fffffffffffff868));
          poVar6 = std::operator<<(poVar6,local_390);
          std::operator<<(poVar6," have duplicated indices\n");
          std::__cxx11::string::~string(local_390);
          std::__cxx11::string::~string(local_370);
          local_3b1 = 1;
          uVar7 = __cxa_allocate_exception(0x28);
          std::__cxx11::ostringstream::str();
          OpenMDException::OpenMDException
                    ((OpenMDException *)in_stack_fffffffffffff6d0._M_current,
                     (string *)in_stack_fffffffffffff6c8._M_current);
          local_3b1 = 0;
          __cxa_throw(uVar7,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
        }
        std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff6d0._M_current);
        local_238 = local_238 + 1;
      }
      poVar6 = std::operator<<((ostream *)local_180,"Error in Molecule ");
      getName_abi_cxx11_((MoleculeStamp *)
                         CONCAT44(in_stack_fffffffffffff6bc,in_stack_fffffffffffff6b8));
      poVar6 = std::operator<<(poVar6,local_308);
      poVar6 = std::operator<<(poVar6,": atoms of inversion");
      containerToString<std::vector<int,std::allocator<int>>>
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT17(in_stack_fffffffffffff86f,in_stack_fffffffffffff868));
      poVar6 = std::operator<<(poVar6,local_328);
      std::operator<<(poVar6," have invalid indices\n");
      std::__cxx11::string::~string(local_328);
      std::__cxx11::string::~string(local_308);
      local_349 = 1;
      uVar7 = __cxa_allocate_exception(0x28);
      std::__cxx11::ostringstream::str();
      OpenMDException::OpenMDException
                ((OpenMDException *)in_stack_fffffffffffff6d0._M_current,
                 (string *)in_stack_fffffffffffff6c8._M_current);
      local_349 = 0;
      __cxa_throw(uVar7,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
    }
    local_1a0 = getInversionStamp(in_stack_fffffffffffff6c0,in_stack_fffffffffffff6bc);
    local_1a4 = InversionStamp::getCenter(local_1a0);
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x2b72e7);
    sVar4 = InversionStamp::getNSatellites((InversionStamp *)0x2b72f4);
    if (sVar4 != 3) {
      for (local_1c8 = 0; uVar1 = local_1c8, sVar4 = getNBonds((MoleculeStamp *)0x2b7339),
          uVar1 < sVar4; local_1c8 = local_1c8 + 1) {
        local_1d0 = getBondStamp(in_stack_fffffffffffff6c0,in_stack_fffffffffffff6bc);
        local_1d4 = BondStamp::getA(local_1d0);
        local_1d8 = BondStamp::getB(local_1d0);
        if (local_1d4 == local_1a4) {
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff6d0._M_current,
                     in_stack_fffffffffffff6c8._M_current);
        }
        if (local_1d8 == local_1a4) {
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff6d0._M_current,
                     in_stack_fffffffffffff6c8._M_current);
        }
      }
      sVar5 = std::vector<int,_std::allocator<int>_>::size(&local_1c0);
      if (sVar5 != 3) {
        poVar6 = std::operator<<((ostream *)local_180,"Error in Molecule ");
        getName_abi_cxx11_((MoleculeStamp *)
                           CONCAT44(in_stack_fffffffffffff6bc,in_stack_fffffffffffff6b8));
        poVar6 = std::operator<<(poVar6,local_208);
        poVar6 = std::operator<<(poVar6,": found wrong number");
        poVar6 = std::operator<<(poVar6," of bonds for inversion center ");
        std::ostream::operator<<(poVar6,local_1a4);
        std::__cxx11::string::~string(local_208);
        local_229 = 1;
        uVar7 = __cxa_allocate_exception(0x28);
        std::__cxx11::ostringstream::str();
        OpenMDException::OpenMDException
                  ((OpenMDException *)in_stack_fffffffffffff6d0._M_current,
                   (string *)in_stack_fffffffffffff6c8._M_current);
        local_229 = 0;
        __cxa_throw(uVar7,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
      }
      local_1e0 = (int *)std::vector<int,_std::allocator<int>_>::begin
                                   ((vector<int,_std::allocator<int>_> *)
                                    CONCAT44(in_stack_fffffffffffff6bc,in_stack_fffffffffffff6b8));
      local_1e8 = (int *)std::vector<int,_std::allocator<int>_>::end
                                   ((vector<int,_std::allocator<int>_> *)
                                    CONCAT44(in_stack_fffffffffffff6bc,in_stack_fffffffffffff6b8));
      std::sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                (in_stack_fffffffffffff6d0,in_stack_fffffffffffff6c8);
      InversionStamp::setSatellites
                ((InversionStamp *)in_stack_fffffffffffff8a0._M_current,
                 (vector<int,_std::allocator<int>_> *)
                 CONCAT17(in_stack_fffffffffffff89f,in_stack_fffffffffffff898));
    }
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff6d0._M_current);
    local_188 = local_188 + 1;
  } while( true );
}

Assistant:

void MoleculeStamp::checkInversions() {
    std::ostringstream oss;

    // first we automatically find the other three atoms that
    // are satellites of an inversion center:

    for (std::size_t i = 0; i < getNInversions(); ++i) {
      InversionStamp* inversionStamp = getInversionStamp(i);
      int center                     = inversionStamp->getCenter();
      std::vector<int> satellites;

      // Some inversions come pre-programmed with the satellites.  If
      // so, don't add the satellites as they are already there.

      if (inversionStamp->getNSatellites() != 3) {
        for (std::size_t j = 0; j < getNBonds(); ++j) {
          BondStamp* bondStamp = getBondStamp(j);
          int a                = bondStamp->getA();
          int b                = bondStamp->getB();

          if (a == center) { satellites.push_back(b); }
          if (b == center) { satellites.push_back(a); }
        }

        if (satellites.size() == 3) {
          std::sort(satellites.begin(), satellites.end());
          inversionStamp->setSatellites(satellites);
        } else {
          oss << "Error in Molecule " << getName() << ": found wrong number"
              << " of bonds for inversion center " << center;
          throw OpenMDException(oss.str());
        }
      }
    }

    // then we do some sanity checking on the inversions:

    for (std::size_t i = 0; i < getNInversions(); ++i) {
      InversionStamp* inversionStamp = getInversionStamp(i);

      std::vector<int> inversionAtoms = inversionStamp->getSatellites();
      // add the central atom to the beginning of the list:
      inversionAtoms.insert(inversionAtoms.begin(),
                            inversionStamp->getCenter());

      std::vector<int>::iterator j =
          std::find_if(inversionAtoms.begin(), inversionAtoms.end(),
                       std::bind(std::greater<int>(), std::placeholders::_1,
                                 getNAtoms() - 1));
      std::vector<int>::iterator k =
          std::find_if(inversionAtoms.begin(), inversionAtoms.end(),
                       std::bind(std::less<int>(), std::placeholders::_1, 0));

      if (j != inversionAtoms.end() || k != inversionAtoms.end()) {
        oss << "Error in Molecule " << getName() << ": atoms of inversion"
            << containerToString(inversionAtoms) << " have invalid indices\n";
        throw OpenMDException(oss.str());
      }

      if (hasDuplicateElement(inversionAtoms)) {
        oss << "Error in Molecule " << getName() << " : atoms of inversion"
            << containerToString(inversionAtoms)
            << " have duplicated indices\n";
        throw OpenMDException(oss.str());
      }
    }

    for (std::size_t i = 0; i < getNInversions(); ++i) {
      InversionStamp* inversionStamp  = getInversionStamp(i);
      std::vector<int> inversionAtoms = inversionStamp->getSatellites();
      inversionAtoms.push_back(inversionStamp->getCenter());
      std::vector<int> rigidSet(getNRigidBodies(), 0);
      std::vector<int>::iterator j;
      for (j = inversionAtoms.begin(); j != inversionAtoms.end(); ++j) {
        int rigidbodyIndex = atom2Rigidbody[*j];
        if (rigidbodyIndex >= 0) {
          ++rigidSet[rigidbodyIndex];
          if (rigidSet[rigidbodyIndex] > 3) {
            oss << "Error in Molecule " << getName()
                << ": inversion centered on atom "
                << inversionStamp->getCenter()
                << " has four atoms that belong to same rigidbody "
                << rigidbodyIndex << "\n";
            throw OpenMDException(oss.str());
          }
        }
      }
    }

    std::set<std::tuple<int, int, int, int>> allInversions;
    std::set<std::tuple<int, int, int, int>>::iterator iter;
    for (std::size_t i = 0; i < getNInversions(); ++i) {
      InversionStamp* inversionStamp = getInversionStamp(i);
      int cent                       = inversionStamp->getCenter();
      std::vector<int> inversion     = inversionStamp->getSatellites();

      std::tuple<int, int, int, int> inversionTuple {
          cent, inversion[0], inversion[1], inversion[2]};
      auto& [first, second, third, fourth] = inversionTuple;

      // In OpenMD, the Central atom in an inversion comes first, and
      // has a special position.  The other three atoms can come in
      // random order, and should be sorted in increasing numerical
      // order to check for duplicates.  This requires three pairwise
      // swaps:
      if (third > fourth) std::swap(third, fourth);
      if (second > third) std::swap(second, third);
      if (third > fourth) std::swap(third, fourth);

      iter = allInversions.find(inversionTuple);
      if (iter == allInversions.end()) {
        allInversions.insert(inversionTuple);
      } else {
        oss << "Error in Molecule " << getName() << ": "
            << "Inversion" << containerToString(inversion)
            << " appears multiple times\n";
        throw OpenMDException(oss.str());
      }
    }

    // Next we automatically find the inversion centers that weren't
    // explicitly created.  An inversion center is any atom that has
    // exactly three bonds to it.  Not all inversion centers have
    // potentials associated with them.

    for (std::size_t i = 0; i < getNAtoms(); ++i) {
      AtomStamp* ai = getAtomStamp(i);
      if (ai->getCoordination() == 3) {
        AtomStamp::AtomIter ai2;
        std::vector<int> satellites;
        for (int a = ai->getFirstBondedAtom(ai2); a != -1;
             a     = ai->getNextBondedAtom(ai2)) {
          satellites.push_back(a);
        }
        if (satellites.size() == 3) {
          int cent = ai->getIndex();
          std::sort(satellites.begin(), satellites.end());

          std::tuple<int, int, int, int> newInversion {
              cent, satellites[0], satellites[1], satellites[2]};
          auto [first, second, third, fourth] = newInversion;

          if (third > fourth) std::swap(third, fourth);
          if (second > third) std::swap(second, third);
          if (third > fourth) std::swap(third, fourth);

          if (allInversions.find(newInversion) == allInversions.end()) {
            allInversions.insert(newInversion);
            InversionStamp* newInversionStamp = new InversionStamp();
            newInversionStamp->setCenter(cent);
            newInversionStamp->setSatellites(satellites);
            addInversionStamp(newInversionStamp);
          }

        } else {
          oss << "Error in Molecule " << getName() << ": found bond mismatch"
              << " when detecting inversion centers.";
          throw OpenMDException(oss.str());
        }
      }
    }
  }